

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O3

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::build_from_roots
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *roots)

{
  iterator __position;
  pointer pGVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  long lVar14;
  undefined1 local_68 [16];
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined8 uStack_40;
  
  local_68._8_8_ = local_68._0_8_;
  lVar14 = (long)(roots->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(roots->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector(__return_storage_ptr__,roots);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_68._8_8_;
  local_68 = auVar8 << 0x40;
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::_M_realloc_insert<field::GF2E>
              (__return_storage_ptr__,__position,(GF2E *)local_68);
  }
  else {
    (__position._M_current)->data = 0;
    (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_50 = lVar14 >> 3;
  local_58 = lVar14;
  if (1 < local_50) {
    uVar13 = 1;
    do {
      pGVar1 = (__return_storage_ptr__->
               super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = pGVar1[uVar13 - 1].data;
      local_48 = pGVar1[uVar13].data;
      pGVar1[uVar13].data = uVar2 ^ local_48;
      uStack_40 = 0;
      uVar10 = uVar13;
      while (uVar9 = uVar10 - 1, uVar9 != 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_48;
        local_68 = (undefined1  [16])0x0;
        for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
            local_68 = local_68 ^ auVar6 << uVar3;
          }
        }
        if (GF2E::reduce._16_8_ == 0) {
          std::__throw_bad_function_call();
        }
        uVar11 = (*(code *)GF2E::reduce._24_8_)(GF2E::reduce,local_68);
        pGVar1 = (__return_storage_ptr__->
                 super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = pGVar1[uVar10 - 2].data;
        pGVar1[uVar9].data = uVar11 ^ uVar2;
        uVar10 = uVar9;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pGVar1->data;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_48;
      local_68 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar5 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          local_68 = local_68 ^ auVar7 << uVar3;
        }
      }
      if (GF2E::reduce._16_8_ == 0) {
        std::__throw_bad_function_call();
      }
      uVar12 = (*(code *)GF2E::reduce._24_8_)(GF2E::reduce,local_68);
      pGVar1->data = uVar12;
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_50);
  }
  *(undefined8 *)
   ((long)&((__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
            _M_impl.super__Vector_impl_data._M_start)->data + local_58) = 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<GF2E> build_from_roots(const std::vector<GF2E> &roots) {
  size_t len = roots.size();

  std::vector<GF2E> poly(roots);
  poly.push_back(GF2E(0));

  GF2E tmp;
  for (size_t k = 1; k < len; k++) {
    tmp = poly[k];
    poly[k] = tmp + poly[k - 1];
    for (size_t i = k - 1; i >= 1; i--) {
      poly[i] = poly[i] * tmp + poly[i - 1];
    }
    poly[0] *= tmp;
  }
  poly[len] = GF2E(1);
  return poly;
}